

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImDrawList *fg_draw_list,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  ulong uVar9;
  unsigned_short *puVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ImVec2 triangle [3];
  undefined8 local_98;
  ImVec2 local_88;
  ImVec2 local_78 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (!show_mesh && !show_aabb) {
    __assert_fail("show_mesh || show_aabb",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3cec,
                  "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImDrawList *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
                 );
  }
  if ((draw_list->IdxBuffer).Size < 1) {
    puVar10 = (unsigned_short *)0x0;
  }
  else {
    puVar10 = (draw_list->IdxBuffer).Data;
  }
  uVar1._0_4_ = (draw_cmd->ClipRect).x;
  uVar1._4_4_ = (draw_cmd->ClipRect).y;
  uVar2._0_4_ = (draw_cmd->ClipRect).z;
  uVar2._4_4_ = (draw_cmd->ClipRect).w;
  uVar3 = fg_draw_list->Flags;
  fg_draw_list->Flags = uVar3 & 0xfffffffe;
  uVar7 = draw_cmd->ElemCount;
  if ((uint)elem_offset < uVar7 + elem_offset) {
    uStack_50 = 0;
    uStack_40 = 0;
    uVar9 = (ulong)(uint)elem_offset;
    auVar17 = _DAT_0019ca70;
    auVar18 = _DAT_0019c9a0;
    local_58 = uVar1;
    local_48 = uVar2;
    do {
      local_78[0].x = 0.0;
      local_78[0].y = 0.0;
      local_78[1].x = 0.0;
      local_78[1].y = 0.0;
      local_78[2].x = 0.0;
      local_78[2].y = 0.0;
      iVar4 = (draw_list->VtxBuffer).Size;
      lVar8 = 0;
      uVar1._0_4_ = auVar18._0_4_;
      uVar2._0_4_ = auVar18._4_4_;
      uVar12 = auVar18._8_4_;
      uVar13 = auVar18._12_4_;
      uVar1._4_4_ = auVar17._0_4_;
      uVar2._4_4_ = auVar17._4_4_;
      uVar14 = auVar17._8_4_;
      uVar15 = auVar17._12_4_;
      do {
        uVar11 = (uint)(uVar9 + lVar8);
        if (puVar10 != (unsigned_short *)0x0) {
          uVar11 = (uint)puVar10[uVar9 + lVar8 & 0xffffffff];
        }
        if (((int)uVar11 < 0) || (iVar4 <= (int)uVar11)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                        ,0x5c3,
                        "const T &ImVector<ImDrawVert>::operator[](int) const [T = ImDrawVert]");
        }
        IVar5 = (draw_list->VtxBuffer).Data[uVar11].pos;
        auVar16._8_8_ = 0;
        auVar16._0_4_ = IVar5.x;
        auVar16._4_4_ = IVar5.y;
        local_78[lVar8] = IVar5;
        auVar17._4_4_ = (float)uVar2;
        auVar17._0_4_ = (float)uVar1;
        auVar17._8_4_ = uVar12;
        auVar17._12_4_ = uVar13;
        auVar18 = minps(auVar16,auVar17);
        auVar6._4_4_ = uVar2._4_4_;
        auVar6._0_4_ = uVar1._4_4_;
        auVar6._8_4_ = uVar14;
        auVar6._12_4_ = uVar15;
        auVar17 = maxps(auVar16,auVar6);
        lVar8 = lVar8 + 1;
        uVar1._0_4_ = auVar18._0_4_;
        uVar2._0_4_ = auVar18._4_4_;
        uVar12 = auVar18._8_4_;
        uVar13 = auVar18._12_4_;
        uVar1._4_4_ = auVar17._0_4_;
        uVar2._4_4_ = auVar17._4_4_;
        uVar14 = auVar17._8_4_;
        uVar15 = auVar17._12_4_;
      } while (lVar8 != 3);
      if (show_mesh) {
        ImDrawList::AddPolyline(fg_draw_list,local_78,3,0xff00ffff,true,1.0);
        uVar7 = draw_cmd->ElemCount;
      }
      uVar9 = uVar9 + 3;
    } while ((uint)uVar9 < uVar7 + elem_offset);
    local_88.y = (float)(int)(float)uVar2;
    local_88.x = (float)(int)(float)uVar1;
    local_98 = CONCAT44((float)(int)uVar2._4_4_,(float)(int)uVar1._4_4_);
    uVar1._0_4_ = (float)local_58;
    uVar1._4_4_ = local_58._4_4_;
    uVar2._0_4_ = (float)local_48;
    uVar2._4_4_ = local_48._4_4_;
  }
  if (show_aabb) {
    local_78[0].y = (float)(int)uVar1._4_4_;
    local_78[0].x = (float)(int)(float)uVar1;
    local_78[3] = (ImVec2)CONCAT44((float)(int)uVar2._4_4_,(float)(int)(float)uVar2);
    ImDrawList::AddRect(fg_draw_list,local_78,local_78 + 3,0xffff00ff,0.0,0xf,1.0);
    local_78[0] = local_88;
    local_78[3].x = (float)(undefined4)local_98;
    local_78[3].y = (float)local_98._4_4_;
    ImDrawList::AddRect(fg_draw_list,local_78,local_78 + 3,0xffffff00,0.0,0xf,1.0);
  }
  fg_draw_list->Flags = uVar3;
  return;
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImDrawList* fg_draw_list, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }